

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

void __thiscall minibag::Player::Player(Player *this,PlayerOptions *options)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  NodeHandle private_node_handle;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  ServiceServer local_108;
  long local_f8 [2];
  undefined1 local_e8 [32];
  _Base_ptr local_c8;
  size_t sStack_c0;
  
  PlayerOptions::PlayerOptions(&this->options_,options);
  pp_Var2 = &local_138._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_138._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)local_138._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  local_e8._24_8_ = local_e8 + 8;
  local_e8._16_8_ = (_Base_ptr)0x0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = 0;
  sStack_c0 = 0;
  local_138._M_impl._0_8_ = pp_Var2;
  local_c8 = (_Base_ptr)local_e8._24_8_;
  miniros::NodeHandle::NodeHandle(&this->node_handle_,(string *)&local_138,(map *)local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_e8);
  if ((_Base_ptr *)local_138._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)local_138._M_impl._0_8_,
                    (ulong)((long)&(local_138._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  (this->pause_service_).impl_.
  super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pause_service_).impl_.
  super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->paused_ = false;
  this->pause_for_topics_ =
       (this->options_).pause_topics.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (this->options_).pause_topics.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  this->pause_change_requested_ = false;
  this->requested_pause_state_ = false;
  p_Var1 = &(this->publishers_)._M_t._M_impl.super__Rb_tree_header;
  (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rate_control_sub_).impl_.
  super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->rate_control_sub_).impl_.
  super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->last_rate_control_).super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)0x0;
  (this->paused_time_).super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
       (TimeBase<miniros::WallTime,_miniros::WallDuration>)0x0;
  (this->bags_).
  super__Vector_base<std::shared_ptr<minibag::Bag>,_std::allocator<std::shared_ptr<minibag::Bag>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bags_).
  super__Vector_base<std::shared_ptr<minibag::Bag>,_std::allocator<std::shared_ptr<minibag::Bag>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bags_).
  super__Vector_base<std::shared_ptr<minibag::Bag>,_std::allocator<std::shared_ptr<minibag::Bag>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->terminal_modified_ = false;
  TimeTranslator::TimeTranslator(&this->time_translator_);
  TimePublisher::TimePublisher(&this->time_publisher_);
  (this->start_time_).super_TimeBase<miniros::Time,_miniros::Duration> =
       (TimeBase<miniros::Time,_miniros::Duration>)0x0;
  (this->bag_length_).super_DurationBase<miniros::Duration> = (DurationBase<miniros::Duration>)0x0;
  local_108.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"~","");
  local_138._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138._M_impl.super__Rb_tree_header._M_header;
  local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._M_impl._0_8_ = 0;
  local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138._M_impl.super__Rb_tree_header._M_header._M_left;
  miniros::NodeHandle::NodeHandle((NodeHandle *)local_e8,(string *)&local_108,(map *)&local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138);
  if (local_108.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_f8) {
    operator_delete(local_108.impl_.
                    super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,local_f8[0] + 1);
  }
  local_138._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"pause_playback","");
  miniros::NodeHandle::
  advertiseService<minibag::Player,std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>
            ((NodeHandle *)&local_108,(string *)local_e8,(offset_in_Player_to_subr)&local_138,
             (Player *)pauseCallback);
  (this->pause_service_).impl_.
  super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_108.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pause_service_).impl_.
              super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &local_108.impl_.
              super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  miniros::ServiceServer::~ServiceServer(&local_108);
  if ((_Base_ptr *)local_138._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)local_138._M_impl._0_8_,
                    (ulong)((long)&(local_138._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  miniros::NodeHandle::~NodeHandle((NodeHandle *)local_e8);
  return;
}

Assistant:

Player::Player(PlayerOptions const& options) :
    options_(options),
    paused_(false),
    // If we were given a list of topics to pause on, then go into that mode
    // by default (it can be toggled later via 't' from the keyboard).
    pause_for_topics_(options_.pause_topics.size() > 0),
    pause_change_requested_(false),
    requested_pause_state_(false),
    terminal_modified_(false)
{
  miniros::NodeHandle private_node_handle("~");
  pause_service_ = private_node_handle.advertiseService("pause_playback", &Player::pauseCallback, this);
}